

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zoombox.c
# Opt level: O0

void zoombox(tgestate_t *state)

{
  attribute_t aVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  int *piVar5;
  int *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int delay;
  uint8_t var;
  uint8_t *pvar;
  attribute_t attrs;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined7 in_stack_fffffffffffffff0;
  
  *(undefined1 *)((long)in_RDI + 0x70e) = 0xc;
  *(undefined1 *)(in_RDI + 0x1c4) = 8;
  aVar1 = choose_game_window_attributes
                    ((tgestate_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  *(attribute_t *)(*(long *)(in_RDI + 6) + 0x1830 + (long)(*in_RDI * 9 + 0x12)) = aVar1;
  *(attribute_t *)(*(long *)(in_RDI + 6) + 0x1830 + (long)(*in_RDI * 9 + 0x13)) = aVar1;
  *(attribute_t *)(*(long *)(in_RDI + 6) + 0x1830 + (long)(*in_RDI * 10 + 0x12)) = aVar1;
  *(attribute_t *)(*(long *)(in_RDI + 6) + 0x1830 + (long)(*in_RDI * 10 + 0x13)) = aVar1;
  *(undefined1 *)((long)in_RDI + 0x70f) = 0;
  *(undefined1 *)((long)in_RDI + 0x711) = 0;
  do {
    (**(code **)(*(long *)(in_RDI + 6) + 0x18))(*(undefined8 *)(in_RDI + 6));
    pcVar4 = (char *)((long)in_RDI + 0x70e);
    cVar2 = *pcVar4;
    if (cVar2 != '\x01') {
      *pcVar4 = *pcVar4 + -1;
      cVar2 = cVar2 + -1;
      *(char *)((long)in_RDI + 0x70f) = *(char *)((long)in_RDI + 0x70f) + '\x01';
    }
    pcVar4 = (char *)((long)in_RDI + 0x70f);
    if ((byte)(cVar2 + *pcVar4) < 0x16) {
      *pcVar4 = *pcVar4 + '\x01';
    }
    piVar5 = in_RDI + 0x1c4;
    cVar2 = (char)*piVar5;
    if (cVar2 != '\x01') {
      *(char *)piVar5 = (char)*piVar5 + -1;
      cVar2 = cVar2 + -1;
      *(char *)((long)in_RDI + 0x711) = *(char *)((long)in_RDI + 0x711) + '\x01';
    }
    pcVar4 = (char *)((long)in_RDI + 0x711);
    if ((byte)(cVar2 + *pcVar4) < 0xf) {
      *pcVar4 = *pcVar4 + '\x01';
    }
    zoombox_fill((tgestate_t *)pvar);
    zoombox_draw_border((tgestate_t *)CONCAT17(aVar1,in_stack_fffffffffffffff0));
    invalidate_bitmap((tgestate_t *)pvar,_delay,unaff_retaddr_00,unaff_retaddr);
    uVar3 = ((uint)*(byte *)((long)in_RDI + 0x711) + (uint)*(byte *)((long)in_RDI + 0x70f)) *
            0x1b167;
    (**(code **)(*(long *)(in_RDI + 6) + 0x20))
              (*(undefined8 *)(in_RDI + 6),uVar3 / 0x23,(ulong)uVar3 % 0x23);
  } while ((uint)*(byte *)((long)in_RDI + 0x711) + (uint)*(byte *)((long)in_RDI + 0x70f) < 0x23);
  return;
}

Assistant:

void zoombox(tgestate_t *state)
{
  attribute_t attrs; /* was A */
  uint8_t    *pvar;  /* was HL */
  uint8_t     var;   /* was A */

  assert(state != NULL);

  state->zoombox.x = 12;
  state->zoombox.y = 8;

  attrs = choose_game_window_attributes(state);

  state->speccy->screen.attributes[ 9 * state->width + 18] = attrs;
  state->speccy->screen.attributes[ 9 * state->width + 19] = attrs;
  state->speccy->screen.attributes[10 * state->width + 18] = attrs;
  state->speccy->screen.attributes[10 * state->width + 19] = attrs;

  state->zoombox.width  = 0;
  state->zoombox.height = 0;

  do
  {
    state->speccy->stamp(state->speccy);

    /* Shrink X and grow width until X is 1 */
    pvar = &state->zoombox.x;
    var = *pvar;
    if (var != 1)
    {
      (*pvar)--;
      var--;
      pvar[1]++;
    }

    /* Grow width until it's 22 */
    pvar++; /* -> &state->width */
    var += *pvar;
    if (var < 22)
      (*pvar)++;

    /* Shrink Y and grow height until Y is 1 */
    pvar++; /* -> &state->zoombox.y */
    var = *pvar;
    if (var != 1)
    {
      (*pvar)--;
      var--;
      pvar[1]++;
    }

    /* Grow height until it's 15 */
    pvar++; /* -> &state->height */
    var += *pvar;
    if (var < 15)
      (*pvar)++;

    zoombox_fill(state);
    zoombox_draw_border(state);

    /* Conv: Invalidation added over the original game. */
    invalidate_bitmap(state,
                      &state->speccy->screen.pixels[0] + game_window_start_offsets[(state->zoombox.y - 1) * 8] + state->zoombox.x - 1,
                      (state->zoombox.width + 2) * 8,
                      (state->zoombox.height + 2) * 8);

    {
      /* Conv: Timing: The original game slows in proportion to the size of
       * the area being zoomboxed. We simulate that here. */
      int delay = (state->zoombox.height + state->zoombox.width) * 110951 / 35;
      state->speccy->sleep(state->speccy, delay);
    }
  }
  while (state->zoombox.height + state->zoombox.width < 35);
}